

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void __thiscall rpc_tests::rpc_togglenetwork::test_method(rpc_togglenetwork *this)

{
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  bool bVar1;
  undefined1 uVar2;
  lazy_ostream *this_00;
  UniValue *this_01;
  long in_FS_OFFSET;
  int numConnection;
  bool netState;
  UniValue r;
  char *in_stack_fffffffffffff838;
  UniValue *in_stack_fffffffffffff840;
  UniValue *in_stack_fffffffffffff848;
  char *in_stack_fffffffffffff850;
  undefined7 in_stack_fffffffffffff858;
  undefined1 in_stack_fffffffffffff85f;
  UniValue *in_stack_fffffffffffff860;
  size_t in_stack_fffffffffffff868;
  size_t line_num;
  undefined7 in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff877;
  allocator<char> *in_stack_fffffffffffff878;
  char *in_stack_fffffffffffff880;
  undefined1 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff888;
  char *pcVar4;
  UniValue *in_stack_fffffffffffff890;
  undefined7 in_stack_fffffffffffff8d8;
  undefined1 in_stack_fffffffffffff8df;
  RPCTestingSetup *in_stack_fffffffffffff8e0;
  UniValue local_609;
  allocator<char> local_5a1 [105];
  const_string local_538;
  lazy_ostream local_528 [2];
  assertion_result local_508 [2];
  allocator<char> local_4ca;
  UniValue local_4c9;
  UniValue local_464;
  int local_400;
  allocator<char> local_3f9 [105];
  const_string local_390;
  lazy_ostream local_380 [2];
  assertion_result local_360 [2];
  allocator<char> local_322;
  UniValue local_321;
  undefined1 local_2ba;
  allocator<char> local_2b9 [33];
  undefined1 local_298 [568];
  char local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::UniValue((UniValue *)in_stack_fffffffffffff838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  RPCTestingSetup::CallRPC
            (in_stack_fffffffffffff8e0,
             (string *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
  UniValue::operator=(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff838);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff838);
  std::allocator<char>::~allocator(local_2b9);
  UniValue::get_obj(in_stack_fffffffffffff840);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
            );
  key._M_str = (char *)in_stack_fffffffffffff888;
  key._M_len = (size_t)in_stack_fffffffffffff880;
  UniValue::find_value(in_stack_fffffffffffff860,key);
  local_2ba = UniValue::get_bool(in_stack_fffffffffffff840);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff848,
               (pointer)in_stack_fffffffffffff840,(unsigned_long)in_stack_fffffffffffff838);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff838);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff878,
               (const_string *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
               in_stack_fffffffffffff868,(const_string *)in_stack_fffffffffffff860);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff840,(char (*) [1])in_stack_fffffffffffff838);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff848,
               (pointer)in_stack_fffffffffffff840,(unsigned_long)in_stack_fffffffffffff838);
    local_321.typ._0_1_ = VOBJ;
    in_stack_fffffffffffff848 = (UniValue *)0x1e7be87;
    in_stack_fffffffffffff840 = &local_321;
    in_stack_fffffffffffff838 = "netState";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              ((undefined1 *)((long)&local_321.val._M_string_length + 1),
               (byte *)((long)&local_321.typ + 1),0xb1,1,2,&local_2ba);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff838);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    RPCTestingSetup::CallRPC
              (in_stack_fffffffffffff8e0,
               (string *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff838);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff838);
    std::allocator<char>::~allocator(&local_322);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff848,
                 (pointer)in_stack_fffffffffffff840,(unsigned_long)in_stack_fffffffffffff838);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff838);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff878,
                 (const_string *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                 in_stack_fffffffffffff868,(const_string *)in_stack_fffffffffffff860);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff848,
                 SUB81((ulong)in_stack_fffffffffffff840 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff840,(char (*) [58])in_stack_fffffffffffff838)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff848,
                 (pointer)in_stack_fffffffffffff840,(unsigned_long)in_stack_fffffffffffff838);
      in_stack_fffffffffffff838 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_360,local_380,&local_390,0xb3,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[58],_const_char_(&)[58]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[58],_const_char_(&)[58]>
                          *)in_stack_fffffffffffff838);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff838);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  RPCTestingSetup::CallRPC
            (in_stack_fffffffffffff8e0,
             (string *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
  UniValue::operator=(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff838);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff838);
  std::allocator<char>::~allocator(local_3f9);
  UniValue::get_obj(in_stack_fffffffffffff840);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
            );
  key_00._M_str = (char *)in_stack_fffffffffffff888;
  key_00._M_len = (size_t)in_stack_fffffffffffff880;
  UniValue::find_value(in_stack_fffffffffffff860,key_00);
  local_400 = UniValue::getInt<int>(in_stack_fffffffffffff890);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff848,
               (pointer)in_stack_fffffffffffff840,(unsigned_long)in_stack_fffffffffffff838);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff838);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff878,
               (const_string *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
               in_stack_fffffffffffff868,(const_string *)in_stack_fffffffffffff860);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff840,(char (*) [1])in_stack_fffffffffffff838);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff848,
               (pointer)in_stack_fffffffffffff840,(unsigned_long)in_stack_fffffffffffff838);
    local_464.typ = VNULL;
    in_stack_fffffffffffff848 = (UniValue *)0x1d1f9c0;
    in_stack_fffffffffffff840 = &local_464;
    in_stack_fffffffffffff838 = "numConnection";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              ((undefined1 *)((long)&local_464.val._M_string_length + 4),&local_464.field_0x4,0xb6,1
               ,2,&local_400);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff838);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniValue::get_obj(in_stack_fffffffffffff840);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
            );
  key_01._M_str = (char *)in_stack_fffffffffffff888;
  key_01._M_len = (size_t)in_stack_fffffffffffff880;
  UniValue::find_value(in_stack_fffffffffffff860,key_01);
  local_2ba = UniValue::get_bool(in_stack_fffffffffffff840);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff848,
               (pointer)in_stack_fffffffffffff840,(unsigned_long)in_stack_fffffffffffff838);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff838);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff878,
               (const_string *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
               in_stack_fffffffffffff868,(const_string *)in_stack_fffffffffffff860);
    this_00 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff840,(char (*) [1])in_stack_fffffffffffff838);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff848,
               (pointer)in_stack_fffffffffffff840,(unsigned_long)in_stack_fffffffffffff838);
    local_4c9.typ._0_1_ = VNULL;
    in_stack_fffffffffffff848 = (UniValue *)0x1e5e060;
    in_stack_fffffffffffff840 = &local_4c9;
    in_stack_fffffffffffff838 = "netState";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              ((undefined1 *)((long)&local_4c9.val._M_string_length + 1),
               (byte *)((long)&local_4c9.typ + 1),0xb9,1,2,&local_2ba);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff838);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    RPCTestingSetup::CallRPC
              ((RPCTestingSetup *)this_00,(string *)CONCAT17(uVar2,in_stack_fffffffffffff8d8));
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff838);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff838);
    std::allocator<char>::~allocator(&local_4ca);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff848,
                 (pointer)in_stack_fffffffffffff840,(unsigned_long)in_stack_fffffffffffff838);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff838);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff878,
                 (const_string *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                 in_stack_fffffffffffff868,(const_string *)in_stack_fffffffffffff860);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff848,
                 SUB81((ulong)in_stack_fffffffffffff840 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff840,(char (*) [57])in_stack_fffffffffffff838)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff848,
                 (pointer)in_stack_fffffffffffff840,(unsigned_long)in_stack_fffffffffffff838);
      in_stack_fffffffffffff838 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_508,local_528,&local_538,0xbb,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_fffffffffffff838);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff838);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  RPCTestingSetup::CallRPC
            ((RPCTestingSetup *)this_00,(string *)CONCAT17(uVar2,in_stack_fffffffffffff8d8));
  pcVar4 = local_60;
  puVar3 = local_298;
  UniValue::operator=(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff838);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff838);
  std::allocator<char>::~allocator(local_5a1);
  UniValue::get_obj(in_stack_fffffffffffff840);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
            );
  key_02._M_str = pcVar4;
  key_02._M_len = (size_t)puVar3;
  this_01 = UniValue::find_value(in_stack_fffffffffffff860,key_02);
  uVar2 = UniValue::get_bool(in_stack_fffffffffffff840);
  local_2ba = uVar2;
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff848,
               (pointer)in_stack_fffffffffffff840,(unsigned_long)in_stack_fffffffffffff838);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff838);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_01,(const_string *)CONCAT17(uVar2,in_stack_fffffffffffff870),
               line_num,(const_string *)in_stack_fffffffffffff860);
    in_stack_fffffffffffff860 = (UniValue *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff840,(char (*) [1])in_stack_fffffffffffff838);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff848,
               (pointer)in_stack_fffffffffffff840,(unsigned_long)in_stack_fffffffffffff838);
    local_609.typ._0_1_ = VOBJ;
    in_stack_fffffffffffff848 = (UniValue *)0x1e7be87;
    in_stack_fffffffffffff840 = &local_609;
    in_stack_fffffffffffff838 = "netState";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              ((undefined1 *)((long)&local_609.val._M_string_length + 1),
               (byte *)((long)&local_609.typ + 1),0xbe,1,2,&local_2ba);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff838);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff838);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_togglenetwork)
{
    UniValue r;

    r = CallRPC("getnetworkinfo");
    bool netState = r.get_obj().find_value("networkactive").get_bool();
    BOOST_CHECK_EQUAL(netState, true);

    BOOST_CHECK_NO_THROW(CallRPC("setnetworkactive false"));
    r = CallRPC("getnetworkinfo");
    int numConnection = r.get_obj().find_value("connections").getInt<int>();
    BOOST_CHECK_EQUAL(numConnection, 0);

    netState = r.get_obj().find_value("networkactive").get_bool();
    BOOST_CHECK_EQUAL(netState, false);

    BOOST_CHECK_NO_THROW(CallRPC("setnetworkactive true"));
    r = CallRPC("getnetworkinfo");
    netState = r.get_obj().find_value("networkactive").get_bool();
    BOOST_CHECK_EQUAL(netState, true);
}